

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::python::Generator::FixAllDescriptorOptions(Generator *this)

{
  bool bVar1;
  int iVar2;
  long in_RDI;
  EnumDescriptor *in_stack_00000028;
  Generator *in_stack_00000030;
  FieldDescriptor *in_stack_00000058;
  int i_2;
  FieldDescriptor *field;
  int i_1;
  EnumDescriptor *enum_descriptor;
  int i;
  string file_options;
  string *in_stack_ffffffffffffff08;
  string *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  int local_9c;
  int local_8c;
  undefined4 in_stack_ffffffffffffff80;
  int iVar3;
  int index;
  undefined4 in_stack_ffffffffffffff84;
  Generator *in_stack_ffffffffffffff88;
  string local_48 [16];
  Descriptor *in_stack_ffffffffffffffc8;
  Generator *in_stack_ffffffffffffffd0;
  string local_28 [40];
  
  FileDescriptor::options(*(FileDescriptor **)(in_RDI + 0x30));
  MessageLite::SerializeAsString_abi_cxx11_
            ((MessageLite *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  OptionsValue(in_stack_ffffffffffffff88,
               (string *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  std::__cxx11::string::~string(local_48);
  bVar1 = std::operator!=(in_stack_ffffffffffffff10,(char *)in_stack_ffffffffffffff08);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xffffffffffffff88,"DESCRIPTOR",(allocator *)&stack0xffffffffffffff87
              );
    anon_unknown_0::PrintDescriptorOptionsFixingCode
              (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,(Printer *)0x4bc3cf);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff88);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff87);
  }
  iVar3 = 0;
  while (index = iVar3, iVar2 = FileDescriptor::enum_type_count(*(FileDescriptor **)(in_RDI + 0x30))
        , iVar3 < iVar2) {
    FileDescriptor::enum_type(*(FileDescriptor **)(in_RDI + 0x30),index);
    FixOptionsForEnum(in_stack_00000030,in_stack_00000028);
    iVar3 = index + 1;
  }
  for (local_8c = 0; iVar3 = FileDescriptor::extension_count(*(FileDescriptor **)(in_RDI + 0x30)),
      local_8c < iVar3; local_8c = local_8c + 1) {
    FileDescriptor::extension(*(FileDescriptor **)(in_RDI + 0x30),local_8c);
    FixOptionsForField((Generator *)field,in_stack_00000058);
  }
  for (local_9c = 0; iVar3 = FileDescriptor::message_type_count(*(FileDescriptor **)(in_RDI + 0x30))
      , local_9c < iVar3; local_9c = local_9c + 1) {
    FileDescriptor::message_type(*(FileDescriptor **)(in_RDI + 0x30),local_9c);
    FixOptionsForMessage(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

void Generator::FixAllDescriptorOptions() const {
  // Prints an expression that sets the file descriptor's options.
  std::string file_options = OptionsValue(file_->options().SerializeAsString());
  if (file_options != "None") {
    PrintDescriptorOptionsFixingCode(kDescriptorKey, file_options, printer_);
  }
  // Prints expressions that set the options for all top level enums.
  for (int i = 0; i < file_->enum_type_count(); ++i) {
    const EnumDescriptor& enum_descriptor = *file_->enum_type(i);
    FixOptionsForEnum(enum_descriptor);
  }
  // Prints expressions that set the options for all top level extensions.
  for (int i = 0; i < file_->extension_count(); ++i) {
    const FieldDescriptor& field = *file_->extension(i);
    FixOptionsForField(field);
  }
  // Prints expressions that set the options for all messages, nested enums,
  // nested extensions and message fields.
  for (int i = 0; i < file_->message_type_count(); ++i) {
    FixOptionsForMessage(*file_->message_type(i));
  }
}